

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void av1_quant(MACROBLOCK *x,int plane,int block,TxfmParam *txfm_param,QUANT_PARAM *qparam)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  intptr_t n_coeffs;
  tran_low_t *dqcoeff_ptr;
  tran_low_t *qcoeff_ptr;
  uint16_t *eob_ptr;
  
  bVar1 = txfm_param->tx_size;
  bVar2 = txfm_param->tx_type;
  iVar4 = block << 4;
  qcoeff_ptr = x->plane[plane].qcoeff + iVar4;
  eob_ptr = x->plane[plane].eobs + block;
  if ((long)qparam->xform_quant_idx != 3) {
    if (((0xc < bVar1) || (n_coeffs = 0x400, (0x1810U >> (bVar1 & 0x1f) & 1) == 0)) &&
       (n_coeffs = 0x200, 1 < (byte)(bVar1 - 0x11))) {
      n_coeffs = (intptr_t)tx_size_2d[bVar1];
    }
    dqcoeff_ptr = x->plane[plane].dqcoeff + iVar4;
    if (x->seg_skip_block == 0) {
      (*quant_func_list[qparam->xform_quant_idx][txfm_param->is_hbd])
                (x->plane[plane].coeff + iVar4,n_coeffs,x->plane + plane,qcoeff_ptr,dqcoeff_ptr,
                 eob_ptr,av1_scan_orders[bVar1] + bVar2,qparam);
    }
    else {
      av1_quantize_skip(n_coeffs,qcoeff_ptr,dqcoeff_ptr,eob_ptr);
    }
  }
  if (qparam->use_optimize_b == 0) {
    uVar3 = av1_get_txb_entropy_context(qcoeff_ptr,av1_scan_orders[bVar1] + bVar2,(uint)*eob_ptr);
  }
  else {
    uVar3 = '\0';
  }
  x->plane[plane].txb_entropy_ctx[block] = uVar3;
  return;
}

Assistant:

void av1_quant(MACROBLOCK *x, int plane, int block, TxfmParam *txfm_param,
               const QUANT_PARAM *qparam) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const SCAN_ORDER *const scan_order =
      get_scan(txfm_param->tx_size, txfm_param->tx_type);
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  tran_low_t *const qcoeff = p->qcoeff + block_offset;
  tran_low_t *const dqcoeff = p->dqcoeff + block_offset;
  uint16_t *const eob = &p->eobs[block];

  if (qparam->xform_quant_idx != AV1_XFORM_QUANT_SKIP_QUANT) {
    const int n_coeffs = av1_get_max_eob(txfm_param->tx_size);
    if (LIKELY(!x->seg_skip_block)) {
#if CONFIG_AV1_HIGHBITDEPTH
      quant_func_list[qparam->xform_quant_idx][txfm_param->is_hbd](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#else
      quant_func_list[qparam->xform_quant_idx](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#endif
    } else {
      av1_quantize_skip(n_coeffs, qcoeff, dqcoeff, eob);
    }
  }
  // use_optimize_b is true means av1_optimze_b will be called,
  // thus cannot update entropy ctx now (performed in optimize_b)
  if (qparam->use_optimize_b) {
    p->txb_entropy_ctx[block] = 0;
  } else {
    p->txb_entropy_ctx[block] =
        av1_get_txb_entropy_context(qcoeff, scan_order, *eob);
  }
}